

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O0

int booster::locale::util::anon_unknown_0::first_day_of_week(char *terr)

{
  bool bVar1;
  int iVar2;
  char *in_RDI;
  _func_bool_char_ptr_char_ptr *in_stack_00000018;
  char **in_stack_00000020;
  char **in_stack_00000028;
  char **in_stack_00000030;
  int local_4;
  
  iVar2 = strcmp(in_RDI,"MV");
  if (iVar2 == 0) {
    local_4 = 5;
  }
  else {
    bVar1 = std::binary_search<char_const*const*,char_const*,bool(*)(char_const*,char_const*)>
                      (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
    if (bVar1) {
      local_4 = 6;
    }
    else {
      bVar1 = std::binary_search<char_const*const*,char_const*,bool(*)(char_const*,char_const*)>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
      if (bVar1) {
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int first_day_of_week(char const *terr) {
            static char const * const sat[] = {
                "AE","AF","BH","DJ","DZ","EG","ER","ET","IQ","IR",
                "JO","KE","KW","LY","MA","OM","QA","SA","SD","SO",
                "SY","TN","YE"
            };
            static char const * const sunday[] = {
                "AR","AS","AZ","BW","CA","CN","FO","GE","GL","GU",
                "HK","IL","IN","JM","JP","KG","KR","LA","MH","MN",
                "MO","MP","MT","NZ","PH","PK","SG","TH","TT","TW",
                "UM","US","UZ","VI","ZW" 
            };
            if(strcmp(terr,"MV") == 0)
                return 5; // fri
            if(std::binary_search<char const * const *>(sat,sat+sizeof(sat)/(sizeof(sat[0])),terr,comparator))
                return 6; // sat
            if(std::binary_search<char const * const *>(sunday,sunday+sizeof(sunday)/(sizeof(sunday[0])),terr,comparator))
                return 0; // sun
            // default
            return 1; // mon
        }